

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# freelist.h
# Opt level: O2

Node * __thiscall
sentencepiece::model::FreeList<sentencepiece::unigram::Lattice::Node>::Allocate
          (FreeList<sentencepiece::unigram::Lattice::Node> *this)

{
  undefined8 *puVar1;
  ulong uVar2;
  Node *pNVar3;
  undefined1 auVar4 [16];
  size_t sVar5;
  ulong uVar6;
  long lVar7;
  pointer ppNVar8;
  Node *chunk;
  
  uVar6 = this->element_index_;
  sVar5 = this->chunk_index_;
  uVar2 = this->chunk_size_;
  if (uVar2 <= uVar6) {
    sVar5 = sVar5 + 1;
    this->chunk_index_ = sVar5;
    this->element_index_ = 0;
    uVar6 = 0;
  }
  ppNVar8 = (this->freelist_).
            super__Vector_base<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (sVar5 == (long)(this->freelist_).
                     super__Vector_base<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)ppNVar8 >> 3) {
    auVar4._8_8_ = 0;
    auVar4._0_8_ = uVar2;
    uVar6 = 0xffffffffffffffff;
    if (SUB168(auVar4 * ZEXT816(0x30),8) == 0) {
      uVar6 = SUB168(auVar4 * ZEXT816(0x30),0);
    }
    chunk = (Node *)operator_new__(uVar6);
    if (uVar2 != 0) {
      lVar7 = 0;
      do {
        puVar1 = (undefined8 *)((long)&(chunk->piece)._M_len + lVar7);
        *puVar1 = 0;
        puVar1[1] = 0;
        lVar7 = lVar7 + 0x30;
      } while (uVar2 * 0x30 - lVar7 != 0);
    }
    memset(chunk,0,uVar2 * 0x30);
    std::
    vector<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>
    ::push_back(&this->freelist_,&chunk);
    sVar5 = this->chunk_index_;
    ppNVar8 = (this->freelist_).
              super__Vector_base<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    uVar6 = this->element_index_;
  }
  pNVar3 = ppNVar8[sVar5];
  this->element_index_ = uVar6 + 1;
  return pNVar3 + uVar6;
}

Assistant:

T* Allocate() {
    if (element_index_ >= chunk_size_) {
      ++chunk_index_;
      element_index_ = 0;
    }

    if (chunk_index_ == freelist_.size()) {
      T* chunk = new T[chunk_size_];
      memset(static_cast<void*>(chunk), 0, sizeof(*chunk) * chunk_size_);
      freelist_.push_back(chunk);
    }

    T* result = freelist_[chunk_index_] + element_index_;
    ++element_index_;

    return result;
  }